

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O2

void __thiscall
flow::diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long,int>
          (Report *this,SourceLocation *sloc,string *f,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long args_1,unsigned_long args_2,int args_3)

{
  string_view format_str;
  _Alloc_hider in_stack_ffffffffffffff70;
  unsigned_long local_70;
  undefined1 local_68 [8];
  SourceLocation local_60;
  
  local_70 = args_2;
  local_68 = (undefined1  [8])args_1;
  SourceLocation::SourceLocation((SourceLocation *)(local_68 + 8),sloc);
  format_str.size_ = (size_t)args;
  format_str.data_ = (char *)f->_M_string_length;
  fmt::v5::format<std::__cxx11::string,unsigned_long,unsigned_long,int>
            ((string *)&stack0xffffffffffffff70,(v5 *)(f->_M_dataplus)._M_p,format_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,&local_70
             ,(unsigned_long *)&args_3,(int *)in_stack_ffffffffffffff70._M_p);
  emplace_back(this,TokenError,(SourceLocation *)(local_68 + 8),(string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string((string *)(local_68 + 8));
  return;
}

Assistant:

void tokenError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TokenError, sloc, fmt::format(f, std::move(args)...));
  }